

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::PostDepthShaderCase::iterate(PostDepthShaderCase *this)

{
  string *vertexSrc;
  ostringstream *poVar1;
  TestContext *this_00;
  int iVar2;
  undefined4 extraout_var;
  ShaderProgram program4;
  ShaderProgram program3;
  ShaderProgram program2;
  ShaderProgram program1;
  undefined1 local_4e0 [384];
  ProgramSources sources4;
  ProgramSources sources3;
  ProgramSources sources2;
  ProgramSources sources1;
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  vertexSrc = &this->m_vertShader;
  glu::makeVtxFragSources(&sources1,vertexSrc,&this->m_fragShader1);
  glu::ShaderProgram::ShaderProgram(&program1,gl,&sources1);
  if (program1.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail checking extension in shader");
    local_4e0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_4e0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Vertex: ");
    std::operator<<((ostream *)poVar1,
                    (string *)
                    &((*program1.m_shaders[0].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_info).infoLog);
    std::operator<<((ostream *)poVar1,"\n");
    std::operator<<((ostream *)poVar1,"Fragment: ");
    std::operator<<((ostream *)poVar1,
                    (string *)
                    &((*program1.m_shaders[1].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_info).infoLog);
    std::operator<<((ostream *)poVar1,"\n");
    std::operator<<((ostream *)poVar1,"Program: ");
    std::operator<<((ostream *)poVar1,(string *)&program1.m_program.m_info);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  else {
    glu::makeVtxFragSources(&sources2,vertexSrc,&this->m_fragShader2);
    glu::ShaderProgram::ShaderProgram(&program2,gl,&sources2);
    if (program2.m_program.m_info.linkOk == false) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail checking preprocessor directives in shader");
      local_4e0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_4e0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Vertex: ");
      std::operator<<((ostream *)poVar1,
                      (string *)
                      &((*program2.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_info).infoLog);
      std::operator<<((ostream *)poVar1,"\n");
      std::operator<<((ostream *)poVar1,"Fragment: ");
      std::operator<<((ostream *)poVar1,
                      (string *)
                      &((*program2.m_shaders[1].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_info).infoLog);
      std::operator<<((ostream *)poVar1,"\n");
      std::operator<<((ostream *)poVar1,"Program: ");
      std::operator<<((ostream *)poVar1,(string *)&program2.m_program.m_info);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    else {
      glu::makeVtxFragSources(&sources3,vertexSrc,&this->m_fragShader3);
      glu::ShaderProgram::ShaderProgram(&program3,gl,&sources3);
      if (program3.m_program.m_info.linkOk == false) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail checking first layout setup in shader");
        local_4e0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_4e0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Vertex: ");
        std::operator<<((ostream *)poVar1,
                        (string *)
                        &((*program3.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog);
        std::operator<<((ostream *)poVar1,"\n");
        std::operator<<((ostream *)poVar1,"Fragment: ");
        std::operator<<((ostream *)poVar1,
                        (string *)
                        &((*program3.m_shaders[1].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog);
        std::operator<<((ostream *)poVar1,"\n");
        std::operator<<((ostream *)poVar1,"Program: ");
        std::operator<<((ostream *)poVar1,(string *)&program3.m_program.m_info);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      else {
        glu::makeVtxFragSources(&sources4,vertexSrc,&this->m_fragShader4);
        glu::ShaderProgram::ShaderProgram(&program4,gl,&sources4);
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        if (program4.m_program.m_info.linkOk == false) {
          tcu::TestContext::setTestResult
                    (this_00,QP_TEST_RESULT_FAIL,"Fail checking second layout setup in shader");
          local_4e0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_4e0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"Vertex: ");
          std::operator<<((ostream *)poVar1,
                          (string *)
                          &((*program4.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog);
          std::operator<<((ostream *)poVar1,"\n");
          std::operator<<((ostream *)poVar1,"Fragment: ");
          std::operator<<((ostream *)poVar1,
                          (string *)
                          &((*program4.m_shaders[1].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog);
          std::operator<<((ostream *)poVar1,"\n");
          std::operator<<((ostream *)poVar1,"Program: ");
          std::operator<<((ostream *)poVar1,(string *)&program4.m_program.m_info);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
        }
        else {
          tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
        }
        glu::ShaderProgram::~ShaderProgram(&program4);
        glu::ProgramSources::~ProgramSources(&sources4);
      }
      glu::ShaderProgram::~ShaderProgram(&program3);
      glu::ProgramSources::~ProgramSources(&sources3);
    }
    glu::ShaderProgram::~ShaderProgram(&program2);
    glu::ProgramSources::~ProgramSources(&sources2);
  }
  glu::ShaderProgram::~ShaderProgram(&program1);
  glu::ProgramSources::~ProgramSources(&sources1);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult PostDepthShaderCase::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	ProgramSources sources1 = makeVtxFragSources(m_vertShader, m_fragShader1);
	ShaderProgram  program1(gl, sources1);

	if (!program1.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking extension in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program1.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program1.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program1.getProgramInfo().infoLog << tcu::TestLog::EndMessage;

		return STOP;
	}

	ProgramSources sources2 = makeVtxFragSources(m_vertShader, m_fragShader2);
	ShaderProgram  program2(gl, sources2);

	if (!program2.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking preprocessor directives in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program2.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program2.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program2.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources3 = makeVtxFragSources(m_vertShader, m_fragShader3);
	ShaderProgram  program3(gl, sources3);

	if (!program3.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking first layout setup in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program3.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program3.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program3.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources4 = makeVtxFragSources(m_vertShader, m_fragShader4);
	ShaderProgram  program4(gl, sources4);

	if (!program4.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking second layout setup in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program4.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program4.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program4.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}